

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simg2img.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int __fd;
  int iVar1;
  long lVar2;
  __off_t _Var3;
  long in_RSI;
  int in_EDI;
  sparse_file *s;
  int i;
  int out;
  int in;
  int local_1c;
  int local_14;
  
  if (in_EDI < 3) {
    usage();
    exit(-1);
  }
  __fd = open(*(char **)(in_RSI + (long)(in_EDI + -1) * 8),0x241,0x1b4);
  if (__fd < 0) {
    fprintf(_stderr,"Cannot open output file %s\n",*(undefined8 *)(in_RSI + (long)(in_EDI + -1) * 8)
           );
    exit(-1);
  }
  local_1c = 1;
  while( true ) {
    if (in_EDI + -1 <= local_1c) {
      close(__fd);
      exit(0);
    }
    iVar1 = strcmp(*(char **)(in_RSI + (long)local_1c * 8),"-");
    if (iVar1 == 0) {
      local_14 = 0;
    }
    else {
      local_14 = open(*(char **)(in_RSI + (long)local_1c * 8),0);
      if (local_14 < 0) {
        fprintf(_stderr,"Cannot open input file %s\n",*(undefined8 *)(in_RSI + (long)local_1c * 8));
        exit(-1);
      }
    }
    lVar2 = sparse_file_import(local_14,1,0);
    if (lVar2 == 0) {
      fprintf(_stderr,"Failed to read sparse file\n");
      exit(-1);
    }
    _Var3 = lseek(__fd,0,0);
    if (_Var3 == -1) {
      perror("lseek failed");
      exit(1);
    }
    iVar1 = sparse_file_write(lVar2,__fd,0,0);
    if (iVar1 < 0) break;
    sparse_file_destroy(lVar2);
    close(local_14);
    local_1c = local_1c + 1;
  }
  fprintf(_stderr,"Cannot write output file\n");
  exit(-1);
}

Assistant:

int main(int argc, char* argv[]) {
  int in;
  int out;
  int i;
  struct sparse_file* s;

  if (argc < 3) {
    usage();
    exit(-1);
  }

  out = open(argv[argc - 1], O_WRONLY | O_CREAT | O_TRUNC | O_BINARY, 0664);
  if (out < 0) {
    fprintf(stderr, "Cannot open output file %s\n", argv[argc - 1]);
    exit(-1);
  }

  for (i = 1; i < argc - 1; i++) {
    if (strcmp(argv[i], "-") == 0) {
      in = STDIN_FILENO;
    } else {
      in = open(argv[i], O_RDONLY | O_BINARY);
      if (in < 0) {
        fprintf(stderr, "Cannot open input file %s\n", argv[i]);
        exit(-1);
      }
    }

    s = sparse_file_import(in, true, false);
    if (!s) {
      fprintf(stderr, "Failed to read sparse file\n");
      exit(-1);
    }

    if (lseek(out, 0, SEEK_SET) == -1) {
      perror("lseek failed");
      exit(EXIT_FAILURE);
    }

    if (sparse_file_write(s, out, false, false, false) < 0) {
      fprintf(stderr, "Cannot write output file\n");
      exit(-1);
    }
    sparse_file_destroy(s);
    close(in);
  }

  close(out);

  exit(0);
}